

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O2

void __thiscall Centaurus::Context<char>::parse(Context<char> *this,char *input_path,int worker_num)

{
  int bank_num;
  pointer ppBVar1;
  pointer ppBVar2;
  __pid_t master_pid;
  Stage1Runner *pSVar3;
  pointer ppBVar4;
  pointer ppBVar5;
  uint uVar6;
  bool bVar7;
  vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> runners;
  ParseContext<char> context;
  _Vector_base<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> local_68;
  Stage1Runner *local_48;
  vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  *local_40;
  void *local_38;
  
  master_pid = getpid();
  local_40 = &this->m_callbacks;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (void *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar3 = (Stage1Runner *)operator_new(0x280);
  bank_num = worker_num * 2;
  Stage1Runner::Stage1Runner
            (pSVar3,input_path,&(this->m_parser).super_IParser,0x800000,bank_num,false,false);
  local_48 = pSVar3;
  std::vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>>::
  emplace_back<Centaurus::BaseRunner*>
            ((vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>> *)&local_68,
             (BaseRunner **)&local_48);
  uVar6 = ~(worker_num >> 0x1f) & worker_num;
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    pSVar3 = (Stage1Runner *)operator_new(0x270);
    Stage2Runner::Stage2Runner
              ((Stage2Runner *)pSVar3,input_path,0x800000,bank_num,master_pid,&local_40,
               (atomic<int> *)0x0);
    pSVar3->m_parser = (IParser *)callback;
    pSVar3->m_current_bank = 0;
    pSVar3->m_counter = 0;
    local_48 = pSVar3;
    std::vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>>::
    emplace_back<Centaurus::BaseRunner*>
              ((vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>> *)&local_68,
               (BaseRunner **)&local_48);
  }
  pSVar3 = (Stage1Runner *)operator_new(0x280);
  Stage3Runner::Stage3Runner
            ((Stage3Runner *)pSVar3,input_path,0x800000,bank_num,master_pid,&local_40,
             (atomic<int> *)0x0);
  pSVar3->m_parser = (IParser *)callback;
  *(TransferListener *)&pSVar3->m_current_bank = (TransferListener)0x0;
  local_48 = pSVar3;
  std::vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>>::
  emplace_back<Centaurus::BaseRunner*>
            ((vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>> *)&local_68,
             (BaseRunner **)&local_48);
  ppBVar1 = local_68._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (((NonRecursiveReductionRunner *)&pSVar3->super_BaseRunner)->super_BaseRunner).
             m_input_window;
  for (ppBVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
      ppBVar2 = local_68._M_impl.super__Vector_impl_data._M_finish,
      ppBVar4 = local_68._M_impl.super__Vector_impl_data._M_start, ppBVar5 != ppBVar1;
      ppBVar5 = ppBVar5 + 1) {
    (*((*ppBVar5)->super_BaseListener)._vptr_BaseListener[5])();
  }
  for (; ppBVar1 = local_68._M_impl.super__Vector_impl_data._M_finish,
      ppBVar5 = local_68._M_impl.super__Vector_impl_data._M_start, ppBVar4 != ppBVar2;
      ppBVar4 = ppBVar4 + 1) {
    (*((*ppBVar4)->super_BaseListener)._vptr_BaseListener[6])();
  }
  for (; ppBVar5 != ppBVar1; ppBVar5 = ppBVar5 + 1) {
    if (*ppBVar5 != (BaseRunner *)0x0) {
      (*((*ppBVar5)->super_BaseListener)._vptr_BaseListener[1])();
    }
  }
  std::_Vector_base<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::
  ~_Vector_base(&local_68);
  return;
}

Assistant:

void parse(const char *input_path, int worker_num)
    {
        int pid = get_current_pid();

        ParseContext<TCHAR> context{m_callbacks, nullptr};

        std::vector<BaseRunner *> runners;
        runners.push_back(new Stage1Runner{ input_path, &m_parser, 8 * 1024 * 1024, worker_num * 2 });
        for (int i = 0; i < worker_num; i++)
        {
            Stage2Runner *st2 = new Stage2Runner{input_path, 8 * 1024 * 1024, worker_num * 2, pid, static_cast<void *>(&context) };

            st2->register_listener(callback);

            runners.push_back(st2);
        }
        Stage3Runner *st3 = new Stage3Runner{ input_path, 8 * 1024 * 1024, worker_num * 2, pid, static_cast<void *>(&context) };

        st3->register_listener(callback);

        runners.push_back(st3);

        context.m_window = st3->get_input();

        for (auto p : runners)
        {
            p->start();
        }
        for (auto p : runners)
        {
            p->wait();
        }
        for (auto p : runners)
        {
            delete p;
        }
    }